

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O1

trie_value trie_remove(trie t,vector keys)

{
  int iVar1;
  trie_node n;
  trie_value unaff_RBX;
  bool bVar2;
  
  if (t != (trie)0x0) {
    n = trie_node_get(t,keys);
    if (n == (trie_node)0x0) {
      bVar2 = true;
    }
    else {
      unaff_RBX = n->value;
      iVar1 = trie_node_clear(t,n);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) {
      return unaff_RBX;
    }
  }
  return (trie_value)0x0;
}

Assistant:

trie_value trie_remove(trie t, vector keys)
{
	if (t != NULL)
	{
		trie_node n = trie_node_get(t, keys);

		if (n != NULL)
		{
			trie_value value = n->value;

			if (trie_node_clear(t, n) == 0)
			{
				return value;
			}
		}
	}

	return NULL;
}